

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

loader_impl loader_impl_create(char *tag)

{
  loader_impl plVar1;
  size_t sVar2;
  configuration pcVar3;
  char acStack_68 [72];
  
  plVar1 = loader_impl_allocate(tag);
  if (plVar1 != (loader_impl)0x0) {
    plVar1->init = 1;
    plVar1->options = (value)0x0;
    sVar2 = strnlen(tag,0x40);
    strncpy(acStack_68,tag,sVar2 + 1);
    strncat(acStack_68,"_loader",0x46 - sVar2);
    pcVar3 = (configuration)configuration_scope(acStack_68);
    plVar1->config = pcVar3;
  }
  return plVar1;
}

Assistant:

loader_impl loader_impl_create(const loader_tag tag)
{
	loader_impl impl = loader_impl_allocate(tag);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->init = 1;
	impl->options = NULL;

	/* Get the configuration of the loader */
	impl->config = loader_impl_initialize_configuration(tag);

	return impl;
}